

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O0

void __thiscall
glslang::HlslParseContext::expandArguments
          (HlslParseContext *this,TSourceLoc *loc,TFunction *function,TIntermTyped **arguments)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  reference ppTVar3;
  undefined4 extraout_var_01;
  long lVar4;
  TType *pTVar5;
  vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_> *this_00;
  size_type sVar6;
  TIntermTyped *local_e8;
  TIntermTyped *local_e0;
  TIntermTyped *local_c8;
  int local_bc;
  undefined1 local_b8 [4];
  int memb;
  TVector<glslang::TIntermTyped_*> memberArgs;
  TIntermTyped *arg;
  undefined1 auStack_88 [4];
  int param;
  anon_class_48_6_daaed5d1 setArgList;
  anon_class_32_4_bb5e3d95 setArg;
  undefined1 auStack_30 [4];
  int functionParamNumberOffset;
  TIntermAggregate *aggregate;
  TIntermTyped **arguments_local;
  TFunction *function_local;
  TSourceLoc *loc_local;
  HlslParseContext *this_local;
  
  aggregate = (TIntermAggregate *)arguments;
  arguments_local = (TIntermTyped **)function;
  function_local = (TFunction *)loc;
  loc_local = (TSourceLoc *)this;
  iVar2 = (*((*arguments)->super_TIntermNode)._vptr_TIntermNode[6])();
  _auStack_30 = (TIntermAggregate *)CONCAT44(extraout_var,iVar2);
  setArg.aggregate._4_4_ = 0;
  setArgList.aggregate = (TIntermAggregate **)arguments_local;
  setArg.function = (TFunction *)((long)&setArg.aggregate + 4);
  setArg.functionParamNumberOffset = (int *)aggregate;
  setArg.arguments = (TIntermTyped **)auStack_30;
  _auStack_88 = (anon_class_32_4_bb5e3d95 *)&setArgList.aggregate;
  setArgList.setArg = (anon_class_32_4_bb5e3d95 *)arguments_local;
  setArgList.function = (TFunction *)((long)&setArg.aggregate + 4);
  setArgList.functionParamNumberOffset = (int *)aggregate;
  setArgList.this = (HlslParseContext *)auStack_30;
  setArgList.arguments = (TIntermTyped **)this;
  for (arg._4_4_ = 0;
      iVar2 = (**(code **)&(*arguments_local)[1].type.qualifier.layoutShaderRecord)(),
      arg._4_4_ < iVar2; arg._4_4_ = arg._4_4_ + 1) {
    iVar2 = (**(code **)&(*arguments_local)[1].type.qualifier.layoutShaderRecord)();
    if (iVar2 == 1) {
      local_e0 = (TIntermTyped *)
                 (**(code **)(*(aggregate->super_TIntermOperator).super_TIntermTyped.
                               super_TIntermNode._vptr_TIntermNode + 0x18))();
    }
    else {
      if (_auStack_30 == (TIntermAggregate *)0x0) {
        local_e8 = (TIntermTyped *)
                   (**(code **)(*(aggregate->super_TIntermOperator).super_TIntermTyped.
                                 super_TIntermNode._vptr_TIntermNode + 0x18))();
      }
      else {
        iVar2 = (*(_auStack_30->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                  _vptr_TIntermNode[0x32])();
        ppTVar3 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::operator[]
                            ((vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
                             CONCAT44(extraout_var_00,iVar2),
                             (long)(arg._4_4_ + setArg.aggregate._4_4_));
        iVar2 = (*(*ppTVar3)->_vptr_TIntermNode[3])();
        local_e8 = (TIntermTyped *)CONCAT44(extraout_var_01,iVar2);
      }
      local_e0 = local_e8;
    }
    memberArgs.
    super_vector<glslang::TIntermTyped_*,_glslang::pool_allocator<glslang::TIntermTyped_*>_>.
    super__Vector_base<glslang::TIntermTyped_*,_glslang::pool_allocator<glslang::TIntermTyped_*>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_e0;
    bVar1 = wasFlattened(this,local_e0);
    if (bVar1) {
      lVar4 = (*(code *)(*arguments_local)[1].type.field_13)(arguments_local,arg._4_4_);
      pTVar5 = *(TType **)(lVar4 + 8);
      lVar4 = (*(code *)(*arguments_local)[1].type.field_13)(arguments_local,arg._4_4_);
      lVar4 = (**(code **)(**(long **)(lVar4 + 8) + 0x50))();
      bVar1 = shouldFlatten(this,pTVar5,(TStorageQualifier)*(undefined8 *)(lVar4 + 8) & 0x7f,true);
      if (bVar1) {
        TVector<glslang::TIntermTyped_*>::TVector((TVector<glslang::TIntermTyped_*> *)local_b8);
        local_bc = 0;
        while( true ) {
          iVar2 = local_bc;
          pTVar5 = (TType *)(**(code **)&(*memberArgs.
                                           super_vector<glslang::TIntermTyped_*,_glslang::pool_allocator<glslang::TIntermTyped_*>_>
                                           .
                                           super__Vector_base<glslang::TIntermTyped_*,_glslang::pool_allocator<glslang::TIntermTyped_*>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage)[1].
                                         type.qualifier.field_0x8)();
          this_00 = &TType::getStruct(pTVar5)->
                     super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>;
          sVar6 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::size
                            (this_00);
          if ((int)sVar6 <= iVar2) break;
          local_c8 = flattenAccess(this,(TIntermTyped *)
                                        memberArgs.
                                        super_vector<glslang::TIntermTyped_*,_glslang::pool_allocator<glslang::TIntermTyped_*>_>
                                        .
                                        super__Vector_base<glslang::TIntermTyped_*,_glslang::pool_allocator<glslang::TIntermTyped_*>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage,local_bc)
          ;
          std::vector<glslang::TIntermTyped_*,_glslang::pool_allocator<glslang::TIntermTyped_*>_>::
          push_back((vector<glslang::TIntermTyped_*,_glslang::pool_allocator<glslang::TIntermTyped_*>_>
                     *)local_b8,&local_c8);
          local_bc = local_bc + 1;
        }
        expandArguments::anon_class_48_6_daaed5d1::operator()
                  ((anon_class_48_6_daaed5d1 *)auStack_88,arg._4_4_ + setArg.aggregate._4_4_,
                   (TVector<glslang::TIntermTyped_*> *)local_b8);
        TVector<glslang::TIntermTyped_*>::~TVector((TVector<glslang::TIntermTyped_*> *)local_b8);
      }
    }
  }
  if (_auStack_30 != (TIntermAggregate *)0x0) {
    addStructBuffArguments(this,(TSourceLoc *)function_local,(TIntermAggregate **)auStack_30);
  }
  return;
}

Assistant:

void HlslParseContext::expandArguments(const TSourceLoc& loc, const TFunction& function, TIntermTyped*& arguments)
{
    TIntermAggregate* aggregate = arguments->getAsAggregate();
    int functionParamNumberOffset = 0;

    // Replace a single argument with a single argument.
    const auto setArg = [&](int paramNum, TIntermTyped* arg) {
        if (function.getParamCount() + functionParamNumberOffset == 1)
            arguments = arg;
        else {
            if (aggregate == nullptr)
                arguments = arg;
            else
                aggregate->getSequence()[paramNum] = arg;
        }
    };

    // Replace a single argument with a list of arguments
    const auto setArgList = [&](int paramNum, const TVector<TIntermTyped*>& args) {
        if (args.size() == 1)
            setArg(paramNum, args.front());
        else if (args.size() > 1) {
            if (function.getParamCount() + functionParamNumberOffset == 1) {
                arguments = intermediate.makeAggregate(args.front());
                std::for_each(args.begin() + 1, args.end(),
                    [&](TIntermTyped* arg) {
                        arguments = intermediate.growAggregate(arguments, arg);
                    });
            } else {
                auto it = aggregate->getSequence().erase(aggregate->getSequence().begin() + paramNum);
                aggregate->getSequence().insert(it, args.begin(), args.end());
            }
            functionParamNumberOffset += (int)(args.size() - 1);
        }
    };

    // Process each argument's conversion
    for (int param = 0; param < function.getParamCount(); ++param) {
        // At this early point there is a slight ambiguity between whether an aggregate 'arguments'
        // is the single argument itself or its children are the arguments.  Only one argument
        // means take 'arguments' itself as the one argument.
        TIntermTyped* arg = function.getParamCount() == 1
                                   ? arguments->getAsTyped()
                                   : (aggregate ?
                                        aggregate->getSequence()[param + functionParamNumberOffset]->getAsTyped() :
                                        arguments->getAsTyped());

        if (wasFlattened(arg) && shouldFlatten(*function[param].type, function[param].type->getQualifier().storage, true)) {
            // Need to pass the structure members instead of the structure.
            TVector<TIntermTyped*> memberArgs;
            for (int memb = 0; memb < (int)arg->getType().getStruct()->size(); ++memb)
                memberArgs.push_back(flattenAccess(arg, memb));
            setArgList(param + functionParamNumberOffset, memberArgs);
        }
    }

    // TODO: if we need both hidden counter args (below) and struct expansion (above)
    // the two algorithms need to be merged: Each assumes the list starts out 1:1 between
    // parameters and arguments.

    // If any argument is a pass-by-reference struct buffer with an associated counter
    // buffer, we have to add another hidden parameter for that counter.
    if (aggregate)
        addStructBuffArguments(loc, aggregate);
}